

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridges_articulations.cpp
# Opt level: O1

int count_from(int v,int skip,bool clean)

{
  ulong *puVar1;
  int iVar2;
  undefined7 in_register_00000011;
  ulong *puVar3;
  
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)&(anonymous_namespace)::usedcnt,(long)V,false);
  iVar2 = DAT_001191a0;
  puVar1 = DAT_00119198;
  if ((int)CONCAT71(in_register_00000011,clean) != 0) {
    puVar3 = (anonymous_namespace)::usedcnt;
    if ((anonymous_namespace)::usedcnt != DAT_00119198) {
      memset((anonymous_namespace)::usedcnt,0,
             (long)DAT_00119198 - (long)(anonymous_namespace)::usedcnt);
      puVar3 = puVar1;
    }
    if (iVar2 != 0) {
      *puVar3 = *puVar3 & ~(0xffffffffffffffffU >> (-(char)iVar2 & 0x3fU));
    }
  }
  iVar2 = count_rec(v,skip);
  return iVar2;
}

Assistant:

int count_from(int v, int skip, bool clean = true){
    usedcnt.resize(V, false);

    if (clean) {
        fill(usedcnt.begin(), usedcnt.end(), false);
    }

    return count_rec(v, skip);
}